

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

void try_send(NetSocket *s)

{
  int iVar1;
  size_t sVar2;
  ssize_t sVar3;
  int *piVar4;
  bool bVar5;
  ptrlen pVar6;
  int local_48;
  void *local_40;
  ptrlen bufdata;
  void *pvStack_28;
  int urgentflag;
  size_t len;
  void *data;
  int err;
  int nsent;
  NetSocket *s_local;
  
  while( true ) {
    bVar5 = true;
    if (s->sending_oob == 0) {
      sVar2 = bufchain_size(&s->output_data);
      bVar5 = sVar2 != 0;
    }
    if (!bVar5) break;
    bVar5 = s->sending_oob == 0;
    if (bVar5) {
      pVar6 = bufchain_prefix(&s->output_data);
      local_40 = pVar6.ptr;
      len = (size_t)local_40;
      bufdata.ptr = (void *)pVar6.len;
      pvStack_28 = bufdata.ptr;
    }
    else {
      pvStack_28 = (void *)s->sending_oob;
      len = (size_t)s->oobdata;
    }
    bufdata.len._5_3_ = 0;
    bufdata.len._4_1_ = !bVar5;
    sVar3 = send(s->s,(void *)len,(size_t)pvStack_28,bufdata.len._4_4_);
    iVar1 = (int)sVar3;
    noise_ultralight(NOISE_SOURCE_IOLEN,(long)iVar1);
    if (iVar1 < 1) {
      if (iVar1 < 0) {
        piVar4 = __errno_location();
        local_48 = *piVar4;
      }
      else {
        local_48 = 0;
      }
      if (local_48 == 0xb) {
        s->writable = false;
      }
      else {
        s->pending_error = local_48;
        uxsel_tell(s);
        queue_toplevel_callback(socket_error_callback,s);
      }
      return;
    }
    if (s->sending_oob == 0) {
      bufchain_consume(&s->output_data,(long)iVar1);
    }
    else if ((void *)(long)iVar1 < pvStack_28) {
      memmove(s->oobdata,s->oobdata + iVar1,(long)pvStack_28 - (long)iVar1);
      s->sending_oob = (long)pvStack_28 - (long)iVar1;
    }
    else {
      s->sending_oob = 0;
    }
  }
  if (s->outgoingeof == EOF_PENDING) {
    shutdown(s->s,1);
    s->outgoingeof = EOF_SENT;
  }
  uxsel_tell(s);
  return;
}

Assistant:

void try_send(NetSocket *s)
{
    while (s->sending_oob || bufchain_size(&s->output_data) > 0) {
        int nsent;
        int err;
        const void *data;
        size_t len;
        int urgentflag;

        if (s->sending_oob) {
            urgentflag = MSG_OOB;
            len = s->sending_oob;
            data = &s->oobdata;
        } else {
            urgentflag = 0;
            ptrlen bufdata = bufchain_prefix(&s->output_data);
            data = bufdata.ptr;
            len = bufdata.len;
        }
        nsent = send(s->s, data, len, urgentflag);
        noise_ultralight(NOISE_SOURCE_IOLEN, nsent);
        if (nsent <= 0) {
            err = (nsent < 0 ? errno : 0);
            if (err == EWOULDBLOCK) {
                /*
                 * Perfectly normal: we've sent all we can for the moment.
                 */
                s->writable = false;
                return;
            } else {
                /*
                 * We unfortunately can't just call plug_closing(),
                 * because it's quite likely that we're currently
                 * _in_ a call from the code we'd be calling back
                 * to, so we'd have to make half the SSH code
                 * reentrant. Instead we flag a pending error on
                 * the socket, to be dealt with (by calling
                 * plug_closing()) at some suitable future moment.
                 */
                s->pending_error = err;
                /*
                 * Immediately cease selecting on this socket, so that
                 * we don't tight-loop repeatedly trying to do
                 * whatever it was that went wrong.
                 */
                uxsel_tell(s);
                /*
                 * Arrange to be called back from the top level to
                 * deal with the error condition on this socket.
                 */
                queue_toplevel_callback(socket_error_callback, s);
                return;
            }
        } else {
            if (s->sending_oob) {
                if (nsent < len) {
                    memmove(s->oobdata, s->oobdata+nsent, len-nsent);
                    s->sending_oob = len - nsent;
                } else {
                    s->sending_oob = 0;
                }
            } else {
                bufchain_consume(&s->output_data, nsent);
            }
        }
    }

    /*
     * If we reach here, we've finished sending everything we might
     * have needed to send. Send EOF, if we need to.
     */
    if (s->outgoingeof == EOF_PENDING) {
        shutdown(s->s, SHUT_WR);
        s->outgoingeof = EOF_SENT;
    }

    /*
     * Also update the select status, because we don't need to select
     * for writing any more.
     */
    uxsel_tell(s);
}